

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

TRef recff_bit64_tohex(jit_State *J,RecordFFData *rd,TRef hdr)

{
  IRRef1 IVar1;
  CTypeID CVar2;
  TRef TVar3;
  uint64_t uVar4;
  uint in_EDX;
  jit_State *in_RDI;
  CTypeID id2;
  int32_t n;
  SFormat sf;
  TRef trsf;
  TRef tr;
  CTypeID id;
  CTState *cts;
  TValue *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  TRef in_stack_ffffffffffffff14;
  jit_State *in_stack_ffffffffffffff18;
  int32_t k;
  undefined6 in_stack_ffffffffffffff20;
  IRRef1 in_stack_ffffffffffffff26;
  undefined6 in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff36;
  undefined8 in_stack_ffffffffffffff38;
  int narg;
  jit_State *pjVar5;
  undefined6 in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff46;
  uint local_b4;
  TRef local_a8;
  
  narg = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  CVar2 = crec_bit64_type((CTState *)in_stack_ffffffffffffff18,
                          (cTValue *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if (in_RDI->base[1] == 0) {
    local_b4 = 8;
    if (CVar2 != 0) {
      local_b4 = 0x10;
    }
  }
  else {
    uVar4 = lj_carith_check64((lua_State *)
                              CONCAT26(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40),narg,
                              (CTypeID *)
                              CONCAT26(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30));
    local_b4 = (uint)uVar4;
    TVar3 = lj_opt_narrow_tobit(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
    IVar1 = (IRRef1)TVar3;
    pjVar5 = in_RDI;
    TVar3 = lj_ir_kint((jit_State *)CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20),
                       (int32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    (pjVar5->fold).ins.field_0.ot = 0x893;
    (pjVar5->fold).ins.field_0.op1 = IVar1;
    (pjVar5->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(in_stack_ffffffffffffff18);
  }
  if ((int)local_b4 < 0) {
    local_b4 = (local_b4 ^ 0xffffffff) + 1;
  }
  if (0xfe < local_b4) {
    local_b4 = 0xfe;
  }
  if (CVar2 == 0) {
    TVar3 = lj_opt_narrow_tobit(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
    IVar1 = (IRRef1)TVar3;
    local_a8._0_2_ = IVar1;
    if ((int)local_b4 < 8) {
      in_stack_ffffffffffffff18 = in_RDI;
      TVar3 = lj_ir_kint((jit_State *)CONCAT26(IVar1,in_stack_ffffffffffffff20),
                         (int32_t)((ulong)in_RDI >> 0x20));
      (in_stack_ffffffffffffff18->fold).ins.field_0.ot = 0x2113;
      (in_stack_ffffffffffffff18->fold).ins.field_0.op1 = IVar1;
      (in_stack_ffffffffffffff18->fold).ins.field_0.op2 = (IRRef1)TVar3;
      TVar3 = lj_opt_fold(in_stack_ffffffffffffff18);
      local_a8._0_2_ = (IRRef1)TVar3;
      in_stack_ffffffffffffff26 = IVar1;
    }
    (in_RDI->fold).ins.field_0.ot = 0x5916;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_a8;
    (in_RDI->fold).ins.field_0.op2 = 0x2d3;
    local_a8 = lj_opt_fold(in_stack_ffffffffffffff18);
    k = (int32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  }
  else {
    local_a8 = crec_bit64_arg((jit_State *)
                              CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20),
                              (CType *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                              in_stack_ffffffffffffff08);
    if ((int)local_b4 < 0x10) {
      IVar1 = (IRRef1)local_a8;
      TVar3 = lj_ir_kint64((jit_State *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           (uint64_t)in_stack_ffffffffffffff08);
      (in_RDI->fold).ins.field_0.ot = 0x2116;
      (in_RDI->fold).ins.field_0.op1 = IVar1;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar3;
      local_a8 = lj_opt_fold(in_stack_ffffffffffffff18);
    }
    k = (int32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  }
  TVar3 = lj_ir_kint((jit_State *)CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20),k);
  TVar3 = lj_ir_call(in_RDI,IRCALL_lj_strfmt_putfxint,(ulong)in_EDX,(ulong)TVar3,(ulong)local_a8);
  return TVar3;
}

Assistant:

TRef recff_bit64_tohex(jit_State *J, RecordFFData *rd, TRef hdr)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID id = crec_bit64_type(cts, &rd->argv[0]);
  TRef tr, trsf = J->base[1];
  SFormat sf = (STRFMT_UINT|STRFMT_T_HEX);
  int32_t n;
  if (trsf) {
    CTypeID id2 = 0;
    n = (int32_t)lj_carith_check64(J->L, 2, &id2);
    if (id2)
      trsf = crec_bit64_arg(J, ctype_get(cts, CTID_INT32), trsf, &rd->argv[1]);
    else
      trsf = lj_opt_narrow_tobit(J, trsf);
    emitir(IRTGI(IR_EQ), trsf, lj_ir_kint(J, n));  /* Specialize to n. */
  } else {
    n = id ? 16 : 8;
  }
  if (n < 0) { n = (int32_t)(~n+1u); sf |= STRFMT_F_UPPER; }
  if ((uint32_t)n > 254) n = 254;
  sf |= ((SFormat)((n+1)&255) << STRFMT_SH_PREC);
  if (id) {
    tr = crec_bit64_arg(J, ctype_get(cts, id), J->base[0], &rd->argv[0]);
    if (n < 16)
      tr = emitir(IRT(IR_BAND, IRT_U64), tr,
		  lj_ir_kint64(J, ((uint64_t)1 << 4*n)-1));
  } else {
    tr = lj_opt_narrow_tobit(J, J->base[0]);
    if (n < 8)
      tr = emitir(IRTI(IR_BAND), tr, lj_ir_kint(J, (int32_t)((1u << 4*n)-1)));
    tr = emitconv(tr, IRT_U64, IRT_INT, 0);  /* No sign-extension. */
    lj_needsplit(J);
  }
  return lj_ir_call(J, IRCALL_lj_strfmt_putfxint, hdr, lj_ir_kint(J, sf), tr);
}